

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

word Abc_TtDeriveBiDecOne(word *pTruth,int nVars,int This)

{
  int nVars_00;
  int nWords_00;
  word wVar1;
  int local_220;
  int nWords;
  int v;
  int nThis;
  word pTemp [64];
  int This_local;
  int nVars_local;
  word *pTruth_local;
  
  pTemp[0x3f]._0_4_ = This;
  pTemp[0x3f]._4_4_ = nVars;
  nVars_00 = Abc_TtBitCount16(This);
  nWords_00 = Abc_TtWordNum(pTemp[0x3f]._4_4_);
  Abc_TtCopy((word *)&v,pTruth,nWords_00,0);
  for (local_220 = 0; local_220 < pTemp[0x3f]._4_4_; local_220 = local_220 + 1) {
    if (((int)(uint)pTemp[0x3f] >> ((byte)local_220 & 0x1f) & 1U) == 0) {
      Abc_TtExist((word *)&v,local_220,nWords_00);
    }
  }
  Abc_TtShrink((word *)&v,nVars_00,pTemp[0x3f]._4_4_,(uint)pTemp[0x3f]);
  wVar1 = Abc_Tt6Stretch(_v,nVars_00);
  return wVar1;
}

Assistant:

static inline word Abc_TtDeriveBiDecOne( word * pTruth, int nVars, int This )
{
    word pTemp[64]; 
    int nThis = Abc_TtBitCount16(This);
    int v, nWords = Abc_TtWordNum(nVars);
    Abc_TtCopy( pTemp, pTruth, nWords, 0 );
    for ( v = 0; v < nVars; v++ )
        if ( !((This >> v) & 1) )
            Abc_TtExist( pTemp, v, nWords );
    Abc_TtShrink( pTemp, nThis, nVars, This );
    return Abc_Tt6Stretch( pTemp[0], nThis );
}